

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

TestCase *
Catch::makeTestCase(TestCase *__return_storage_ptr__,ITestInvoker *_testCase,string *_className,
                   NameAndTags *nameAndTags,SourceLineInfo *_lineInfo)

{
  char cVar1;
  size_type sVar2;
  char *pcVar3;
  pointer pbVar4;
  SpecialProperties SVar5;
  int iVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  bool bVar8;
  size_type sVar9;
  long lVar10;
  bool bVar11;
  string tag;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tags;
  string desc;
  TestCaseInfo info;
  string local_178;
  NameAndTags *local_158;
  TestCase *local_150;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_148;
  string local_128;
  string local_108;
  ITestInvoker *local_e8;
  string *local_e0;
  undefined1 local_d8 [32];
  _Alloc_hider local_b8 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  _Alloc_hider local_98 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60 [2];
  
  local_148.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_148.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_148.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  local_108._M_string_length = 0;
  local_108.field_2._M_local_buf[0] = '\0';
  local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
  local_178._M_string_length = 0;
  local_178.field_2._M_local_buf[0] = '\0';
  sVar2 = (nameAndTags->tags).m_size;
  local_e8 = _testCase;
  local_e0 = _className;
  if (sVar2 != 0) {
    pcVar3 = (nameAndTags->tags).m_start;
    sVar9 = 0;
    bVar11 = false;
    bVar8 = false;
    local_158 = nameAndTags;
    local_150 = __return_storage_ptr__;
    do {
      cVar1 = pcVar3[sVar9];
      if (bVar8) {
        if (cVar1 == ']') {
          SVar5 = anon_unknown_2::parseSpecialTag(&local_178);
          bVar8 = true;
          if (((((SVar5 & IsHidden) == None) && (bVar8 = bVar11, SVar5 == None)) &&
              (SVar5 = anon_unknown_2::parseSpecialTag(&local_178),
              local_178._M_string_length != 0 && SVar5 == None)) &&
             (iVar6 = isalnum((uint)(byte)*local_178._M_dataplus._M_p), iVar6 == 0)) {
            ReusableStringStream::ReusableStringStream((ReusableStringStream *)&local_128);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_128.field_2._M_allocated_capacity,"Tag name: [",0xb);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_128.field_2._M_allocated_capacity,local_178._M_dataplus._M_p
                       ,local_178._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_128.field_2._M_allocated_capacity,"] is not allowed.\n",0x12
                      );
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_128.field_2._M_allocated_capacity,
                       "Tag names starting with non alphanumeric characters are reserved\n",0x41);
            operator<<((ostream *)local_128.field_2._M_allocated_capacity,_lineInfo);
            std::__cxx11::stringbuf::str();
            throw_domain_error((string *)local_d8);
          }
          if (((local_178._M_string_length != 0) && (local_178._M_string_length != 1)) &&
             (*local_178._M_dataplus._M_p == 0x2e)) {
            std::__cxx11::string::erase((ulong)&local_178,0);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_148,(value_type *)&local_178);
          local_178._M_string_length = 0;
          *local_178._M_dataplus._M_p = 0;
          bVar11 = bVar8;
LAB_001887aa:
          bVar8 = false;
        }
        else {
          bVar8 = true;
          std::__cxx11::string::push_back((char)&local_178);
        }
      }
      else {
        bVar8 = true;
        if (cVar1 != '[') {
          std::__cxx11::string::push_back((char)&local_108);
          goto LAB_001887aa;
        }
      }
      pbVar4 = local_148.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      sVar9 = sVar9 + 1;
    } while (sVar2 != sVar9);
    nameAndTags = local_158;
    __return_storage_ptr__ = local_150;
    if (bVar11) {
      local_d8._0_8_ = local_d8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,".","");
      paVar7 = &local_a8;
      local_b8[0]._M_p = (pointer)paVar7;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"!hide","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_insert<std::__cxx11::string_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_148,
                 pbVar4,local_d8,local_98);
      lVar10 = -0x40;
      do {
        if (paVar7 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(&paVar7->_M_allocated_capacity)[-2]) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(&paVar7->_M_allocated_capacity)[-2],paVar7->_M_allocated_capacity + 1)
          ;
        }
        paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(&paVar7->_M_allocated_capacity + -4);
        lVar10 = lVar10 + 0x20;
        nameAndTags = local_158;
        __return_storage_ptr__ = local_150;
      } while (lVar10 != 0);
    }
  }
  pcVar3 = (nameAndTags->name).m_start;
  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_128,pcVar3,pcVar3 + (nameAndTags->name).m_size);
  TestCaseInfo::TestCaseInfo
            ((TestCaseInfo *)local_d8,&local_128,local_e0,&local_108,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_148,_lineInfo);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p,(ulong)(local_128.field_2._M_allocated_capacity + 1))
    ;
  }
  TestCase::TestCase(__return_storage_ptr__,local_e8,(TestCaseInfo *)local_d8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(local_60);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98[0]._M_p != &local_88) {
    operator_delete(local_98[0]._M_p,local_88._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8[0]._M_p != &local_a8) {
    operator_delete(local_b8[0]._M_p,local_a8._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
    operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p,
                    CONCAT71(local_178.field_2._M_allocated_capacity._1_7_,
                             local_178.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,
                    CONCAT71(local_108.field_2._M_allocated_capacity._1_7_,
                             local_108.field_2._M_local_buf[0]) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_148);
  return __return_storage_ptr__;
}

Assistant:

TestCase makeTestCase(  ITestInvoker* _testCase,
                            std::string const& _className,
                            NameAndTags const& nameAndTags,
                            SourceLineInfo const& _lineInfo )
    {
        bool isHidden = false;

        // Parse out tags
        std::vector<std::string> tags;
        std::string desc, tag;
        bool inTag = false;
        for (char c : nameAndTags.tags) {
            if( !inTag ) {
                if( c == '[' )
                    inTag = true;
                else
                    desc += c;
            }
            else {
                if( c == ']' ) {
                    TestCaseInfo::SpecialProperties prop = parseSpecialTag( tag );
                    if( ( prop & TestCaseInfo::IsHidden ) != 0 )
                        isHidden = true;
                    else if( prop == TestCaseInfo::None )
                        enforceNotReservedTag( tag, _lineInfo );

                    // Merged hide tags like `[.approvals]` should be added as
                    // `[.][approvals]`. The `[.]` is added at later point, so
                    // we only strip the prefix
                    if (startsWith(tag, '.') && tag.size() > 1) {
                        tag.erase(0, 1);
                    }
                    tags.push_back( tag );
                    tag.clear();
                    inTag = false;
                }
                else
                    tag += c;
            }
        }
        if( isHidden ) {
            // Add all "hidden" tags to make them behave identically
            tags.insert( tags.end(), { ".", "!hide" } );
        }

        TestCaseInfo info( static_cast<std::string>(nameAndTags.name), _className, desc, tags, _lineInfo );
        return TestCase( _testCase, std::move(info) );
    }